

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

size_t bitset_maximum(bitset_t *bitset)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  
  sVar4 = bitset->arraysize;
  lVar3 = sVar4 * -0x40;
  do {
    bVar5 = sVar4 == 0;
    sVar4 = sVar4 - 1;
    if (bVar5) {
      return 0;
    }
    uVar1 = bitset->array[sVar4];
    lVar3 = lVar3 + 0x40;
  } while (uVar1 == 0);
  uVar2 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  return (uVar2 ^ 0x3f) - lVar3 ^ 0x3f;
}

Assistant:

size_t bitset_maximum(const bitset_t *bitset) {
    for (size_t k = bitset->arraysize; k > 0; k--) {
        uint64_t w = bitset->array[k - 1];
        if (w != 0) {
            return 63 - roaring_leading_zeroes(w) + (k - 1) * 64;
        }
    }
    return 0;
}